

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void free(void *__ptr)

{
  malloc_tree_chunk *pmVar1;
  malloc_tree_chunk *pmVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  tbinptr pmVar7;
  size_t __len;
  tbinptr *ppmVar8;
  size_t *psVar9;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  tchunkptr F_5;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_3;
  tbinptr *H_2;
  tchunkptr tp;
  mchunkptr F_4;
  mchunkptr B_2;
  bindex_t I_2;
  tchunkptr C1_1;
  tchunkptr C0_1;
  tbinptr *H_1;
  tchunkptr *CP_1;
  tchunkptr *RP_1;
  tchunkptr F_3;
  tchunkptr R_1;
  tchunkptr XP_1;
  tchunkptr TP_1;
  bindex_t I_1;
  mchunkptr B_1;
  mchunkptr F_2;
  size_t nsize;
  size_t dsize;
  size_t tsize;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  mchunkptr prev;
  size_t prevsize;
  mchunkptr next;
  size_t psize;
  mchunkptr p;
  void *mem_local;
  
  iVar5 = _gm_.mutex;
  if (__ptr == (void *)0x0) {
    return;
  }
  psize = (long)__ptr + -0x10;
  if ((_gm_.mflags & 2) != 0) {
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if ((iVar5 != 0) && (iVar5 = spin_acquire_lock(&_gm_.mutex), iVar5 != 0)) {
      return;
    }
  }
  bVar12 = false;
  if (_gm_.least_addr <= psize) {
    bVar12 = (*(ulong *)((long)__ptr + -8) & 3) != 1;
  }
  if (!bVar12) goto LAB_0010783d;
  next = (mchunkptr)(*(ulong *)((long)__ptr + -8) & 0xfffffffffffffff8);
  pmVar7 = (tbinptr)(psize + (long)next);
  if ((*(ulong *)((long)__ptr + -8) & 1) != 0) goto LAB_00106c4f;
  uVar11 = *(ulong *)psize;
  if ((*(ulong *)((long)__ptr + -8) & 3) == 0) {
    __len = (long)&next[1].prev_foot + uVar11;
    iVar5 = munmap((void *)(psize - uVar11),__len);
    next = (mchunkptr)_gm_.dvsize;
    if (iVar5 == 0) {
      _gm_.footprint = _gm_.footprint - __len;
    }
    goto LAB_00107842;
  }
  psize = psize - uVar11;
  next = (mchunkptr)((long)&next->prev_foot + uVar11);
  if (psize < _gm_.least_addr) goto LAB_0010783d;
  if ((mchunkptr)psize == _gm_.dv) {
    if ((pmVar7->head & 3) == 3) {
      _gm_.dvsize = (size_t)next;
      pmVar7->head = pmVar7->head & 0xfffffffffffffffe;
      ((tbinptr)psize)->head = (ulong)next | 1;
      *(mchunkptr *)((long)&next[-1].prev_foot + (long)((tbinptr)psize)->child) = next;
      next = (mchunkptr)_gm_.dvsize;
      goto LAB_00107842;
    }
  }
  else if (uVar11 >> 3 < 0x20) {
    pmVar1 = ((tbinptr)psize)->fd;
    pmVar2 = ((tbinptr)psize)->bk;
    iVar5 = (int)(uVar11 >> 3);
    bVar12 = true;
    if ((pmVar1 != (malloc_tree_chunk *)(_gm_.smallbins + (uint)(iVar5 << 1))) &&
       (bVar12 = false, _gm_.least_addr <= pmVar1)) {
      bVar12 = pmVar1->bk == (tbinptr)psize;
    }
    if (!bVar12) {
      abort();
    }
    if (pmVar2 == pmVar1) {
      _gm_.smallmap = (1 << ((byte)(uVar11 >> 3) & 0x1f) ^ 0xffffffffU) & _gm_.smallmap;
    }
    else {
      bVar12 = true;
      if ((pmVar2 != (malloc_tree_chunk *)(_gm_.smallbins + (uint)(iVar5 << 1))) &&
         (bVar12 = false, _gm_.least_addr <= pmVar2)) {
        bVar12 = pmVar2->fd == (tbinptr)psize;
      }
      if (!bVar12) {
        abort();
      }
      pmVar1->bk = pmVar2;
      pmVar2->fd = pmVar1;
    }
  }
  else {
    pmVar1 = ((tbinptr)psize)->parent;
    if (((tbinptr)psize)->bk == (tbinptr)psize) {
      CP = ((tbinptr)psize)->child + 1;
      F_1 = ((tbinptr)psize)->child[1];
      if (F_1 == (malloc_tree_chunk *)0x0) {
        CP = ((tbinptr)psize)->child;
        F_1 = ((tbinptr)psize)->child[0];
        if (F_1 == (malloc_tree_chunk *)0x0) goto LAB_00106a42;
      }
      while( true ) {
        H = F_1->child + 1;
        bVar12 = true;
        if (F_1->child[1] == (malloc_tree_chunk *)0x0) {
          H = F_1->child;
          bVar12 = F_1->child[0] != (malloc_tree_chunk *)0x0;
        }
        if (!bVar12) break;
        CP = H;
        F_1 = *H;
      }
      if (CP < _gm_.least_addr) {
        abort();
      }
      *CP = (tchunkptr)0x0;
    }
    else {
      pmVar2 = ((tbinptr)psize)->fd;
      F_1 = ((tbinptr)psize)->bk;
      bVar12 = false;
      if ((_gm_.least_addr <= pmVar2) && (bVar12 = false, pmVar2->bk == (tbinptr)psize)) {
        bVar12 = F_1->fd == (tbinptr)psize;
      }
      if (!bVar12) {
        abort();
      }
      pmVar2->bk = F_1;
      F_1->fd = pmVar2;
    }
LAB_00106a42:
    if (pmVar1 != (malloc_tree_chunk *)0x0) {
      if ((tbinptr)psize == _gm_.treebins[((tbinptr)psize)->index]) {
        _gm_.treebins[((tbinptr)psize)->index] = F_1;
        if (F_1 == (tchunkptr)0x0) {
          _gm_.treemap = (1 << ((byte)((tbinptr)psize)->index & 0x1f) ^ 0xffffffffU) & _gm_.treemap;
        }
      }
      else {
        if (pmVar1 < _gm_.least_addr) {
          abort();
        }
        if (pmVar1->child[0] == (tbinptr)psize) {
          pmVar1->child[0] = F_1;
        }
        else {
          pmVar1->child[1] = F_1;
        }
      }
      if (F_1 != (tchunkptr)0x0) {
        if (F_1 < _gm_.least_addr) {
          abort();
        }
        F_1->parent = pmVar1;
        pmVar1 = ((tbinptr)psize)->child[0];
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          if (pmVar1 < _gm_.least_addr) {
            abort();
          }
          F_1->child[0] = pmVar1;
          pmVar1->parent = F_1;
        }
        pmVar1 = ((tbinptr)psize)->child[1];
        if (pmVar1 != (malloc_tree_chunk *)0x0) {
          if (pmVar1 < _gm_.least_addr) {
            abort();
          }
          F_1->child[1] = pmVar1;
          pmVar1->parent = F_1;
        }
      }
    }
  }
LAB_00106c4f:
  bVar12 = false;
  if (psize < pmVar7) {
    bVar12 = (pmVar7->head & 1) != 0;
  }
  if (!bVar12) {
LAB_0010783d:
    abort();
  }
  if ((pmVar7->head & 2) == 0) {
    if (pmVar7 == (tbinptr)_gm_.top) {
      uVar11 = (long)&next->prev_foot + _gm_.topsize;
      _gm_.top = (mchunkptr)psize;
      _gm_.topsize = uVar11;
      *(ulong *)(psize + 8) = uVar11 | 1;
      if ((mchunkptr)psize == _gm_.dv) {
        _gm_.dv = (mchunkptr)0x0;
        _gm_.dvsize = 0;
      }
      next = (mchunkptr)_gm_.dvsize;
      if (_gm_.trim_check < uVar11) {
        sys_trim(&_gm_,0);
        next = (mchunkptr)_gm_.dvsize;
      }
      goto LAB_00107842;
    }
    if (pmVar7 == (tbinptr)_gm_.dv) {
      uVar11 = (long)&next->prev_foot + _gm_.dvsize;
      _gm_.dv = (mchunkptr)psize;
      _gm_.dvsize = uVar11;
      *(ulong *)(psize + 8) = uVar11 | 1;
      *(ulong *)(psize + uVar11) = uVar11;
      next = (mchunkptr)_gm_.dvsize;
      goto LAB_00107842;
    }
    uVar11 = pmVar7->head;
    next = (mchunkptr)((long)&next->prev_foot + (uVar11 & 0xfffffffffffffff8));
    if (uVar11 >> 3 < 0x20) {
      pmVar1 = pmVar7->fd;
      pmVar2 = pmVar7->bk;
      iVar5 = (int)(uVar11 >> 3);
      bVar12 = true;
      if ((pmVar1 != (malloc_tree_chunk *)(_gm_.smallbins + (uint)(iVar5 << 1))) &&
         (bVar12 = false, _gm_.least_addr <= pmVar1)) {
        bVar12 = pmVar1->bk == pmVar7;
      }
      if (!bVar12) {
        abort();
      }
      if (pmVar2 == pmVar1) {
        _gm_.smallmap = (1 << ((byte)(uVar11 >> 3) & 0x1f) ^ 0xffffffffU) & _gm_.smallmap;
      }
      else {
        bVar12 = true;
        if ((pmVar2 != (malloc_tree_chunk *)(_gm_.smallbins + (uint)(iVar5 << 1))) &&
           (bVar12 = false, _gm_.least_addr <= pmVar2)) {
          bVar12 = pmVar2->fd == pmVar7;
        }
        if (!bVar12) {
          abort();
        }
        pmVar1->bk = pmVar2;
        pmVar2->fd = pmVar1;
      }
    }
    else {
      pmVar1 = pmVar7->parent;
      if (pmVar7->bk == pmVar7) {
        CP_1 = pmVar7->child + 1;
        F_3 = pmVar7->child[1];
        if (F_3 == (malloc_tree_chunk *)0x0) {
          CP_1 = pmVar7->child;
          F_3 = pmVar7->child[0];
          if (F_3 == (malloc_tree_chunk *)0x0) goto LAB_0010714d;
        }
        while( true ) {
          H_1 = F_3->child + 1;
          bVar12 = true;
          if (F_3->child[1] == (malloc_tree_chunk *)0x0) {
            H_1 = F_3->child;
            bVar12 = F_3->child[0] != (malloc_tree_chunk *)0x0;
          }
          if (!bVar12) break;
          CP_1 = H_1;
          F_3 = *H_1;
        }
        if (CP_1 < _gm_.least_addr) {
          abort();
        }
        *CP_1 = (tchunkptr)0x0;
      }
      else {
        pmVar2 = pmVar7->fd;
        F_3 = pmVar7->bk;
        bVar12 = false;
        if ((_gm_.least_addr <= pmVar2) && (bVar12 = false, pmVar2->bk == pmVar7)) {
          bVar12 = F_3->fd == pmVar7;
        }
        if (!bVar12) {
          abort();
        }
        pmVar2->bk = F_3;
        F_3->fd = pmVar2;
      }
LAB_0010714d:
      if (pmVar1 != (malloc_tree_chunk *)0x0) {
        if (pmVar7 == _gm_.treebins[pmVar7->index]) {
          _gm_.treebins[pmVar7->index] = F_3;
          if (F_3 == (tchunkptr)0x0) {
            _gm_.treemap = (1 << ((byte)pmVar7->index & 0x1f) ^ 0xffffffffU) & _gm_.treemap;
          }
        }
        else {
          if (pmVar1 < _gm_.least_addr) {
            abort();
          }
          if (pmVar1->child[0] == pmVar7) {
            pmVar1->child[0] = F_3;
          }
          else {
            pmVar1->child[1] = F_3;
          }
        }
        if (F_3 != (tchunkptr)0x0) {
          if (F_3 < _gm_.least_addr) {
            abort();
          }
          F_3->parent = pmVar1;
          pmVar1 = pmVar7->child[0];
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            if (pmVar1 < _gm_.least_addr) {
              abort();
            }
            F_3->child[0] = pmVar1;
            pmVar1->parent = F_3;
          }
          pmVar1 = pmVar7->child[1];
          if (pmVar1 != (malloc_tree_chunk *)0x0) {
            if (pmVar1 < _gm_.least_addr) {
              abort();
            }
            F_3->child[1] = pmVar1;
            pmVar1->parent = F_3;
          }
        }
      }
    }
    *(ulong *)(psize + 8) = (ulong)next | 1;
    *(mchunkptr *)((long)&next->prev_foot + psize) = next;
    if ((mchunkptr)psize == _gm_.dv) goto LAB_00107842;
  }
  else {
    pmVar7->head = pmVar7->head & 0xfffffffffffffffe;
    *(ulong *)(psize + 8) = (ulong)next | 1;
    *(mchunkptr *)((long)&next->prev_foot + psize) = next;
  }
  if ((ulong)next >> 3 < 0x20) {
    uVar11 = (ulong)(uint)((int)((ulong)next >> 3) << 1);
    bVar10 = (byte)((ulong)next >> 3);
    if ((_gm_.smallmap & 1 << (bVar10 & 0x1f)) == 0) {
      _gm_.smallmap = 1 << (bVar10 & 0x1f) | _gm_.smallmap;
      tp = (tchunkptr)(_gm_.smallbins + uVar11);
    }
    else {
      if (_gm_.smallbins[uVar11 + 2] < _gm_.least_addr) {
        abort();
      }
      tp = (tchunkptr)_gm_.smallbins[uVar11 + 2];
    }
    _gm_.smallbins[uVar11 + 2] = (mchunkptr)psize;
    tp->bk = (malloc_tree_chunk *)psize;
    *(tchunkptr *)(psize + 0x10) = tp;
    *(tchunkptr *)(psize + 0x18) = (tchunkptr)(_gm_.smallbins + uVar11);
    next = (mchunkptr)_gm_.dvsize;
  }
  else {
    uVar6 = (uint)((ulong)next >> 8);
    if (uVar6 == 0) {
      K = 0;
    }
    else if (uVar6 < 0x10000) {
      uVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      iVar5 = 0x1f - (uVar4 ^ 0x1f);
      K = iVar5 * 2 + ((uint)((ulong)next >> ((char)iVar5 + 7U & 0x3f)) & 1);
    }
    else {
      K = 0x1f;
    }
    ppmVar8 = _gm_.treebins + K;
    *(uint *)(psize + 0x38) = K;
    *(undefined8 *)(psize + 0x28) = 0;
    *(undefined8 *)(psize + 0x20) = 0;
    if ((_gm_.treemap & 1 << ((byte)K & 0x1f)) == 0) {
      _gm_.treemap = 1 << ((byte)K & 0x1f) | _gm_.treemap;
      *ppmVar8 = (tbinptr)psize;
      *(tbinptr **)(psize + 0x30) = ppmVar8;
      *(size_t *)(psize + 0x18) = psize;
      *(size_t *)(psize + 0x10) = psize;
    }
    else {
      K_1 = (size_t)*ppmVar8;
      if (K == 0x1f) {
        bVar10 = 0;
      }
      else {
        bVar10 = 0x3f - ((char)(K >> 1) + '\x06');
      }
      C = (tchunkptr *)((long)next << (bVar10 & 0x3f));
      while ((mchunkptr)(*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != next) {
        psVar9 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
        C = (tchunkptr *)((long)C << 1);
        if (*psVar9 == 0) {
          if (psVar9 < _gm_.least_addr) {
            abort();
          }
          *psVar9 = psize;
          *(size_t *)(psize + 0x30) = K_1;
          *(size_t *)(psize + 0x18) = psize;
          *(size_t *)(psize + 0x10) = psize;
          goto LAB_00107811;
        }
        K_1 = *psVar9;
      }
      pcVar3 = *(char **)(K_1 + 0x10);
      if (K_1 < _gm_.least_addr || pcVar3 < _gm_.least_addr) {
        abort();
      }
      *(size_t *)(pcVar3 + 0x18) = psize;
      *(size_t *)(K_1 + 0x10) = psize;
      *(char **)(psize + 0x10) = pcVar3;
      *(size_t *)(psize + 0x18) = K_1;
      *(undefined8 *)(psize + 0x30) = 0;
    }
LAB_00107811:
    _gm_.release_checks = _gm_.release_checks - 1;
    next = (mchunkptr)_gm_.dvsize;
    if (_gm_.release_checks == 0) {
      release_unused_segments(&_gm_);
      next = (mchunkptr)_gm_.dvsize;
    }
  }
LAB_00107842:
  _gm_.dvsize = (size_t)next;
  if ((_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return;
}

Assistant:

void dlfree(void* mem) {
  /*
     Consolidate freed chunks with preceeding or succeeding bordering
     free chunks, if they exist, and then place in a bin.  Intermixed
     with special cases for top, dv, mmapped chunks, and usage errors.
  */

  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
#else /* FOOTERS */
#define fm gm
#endif /* FOOTERS */
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
#if !FOOTERS
#undef fm
#endif /* FOOTERS */
}